

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ChainPromiseNode::ChainPromiseNode
          (ChainPromiseNode *this,Own<kj::_::PromiseNode> *innerParam)

{
  Own<kj::_::PromiseNode> *other;
  PromiseNode *pPVar1;
  Own<kj::_::PromiseNode> *innerParam_local;
  ChainPromiseNode *this_local;
  
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  Event::Event(&this->super_Event);
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_005d2830;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_005d2868;
  *(undefined4 *)&(this->super_Event).field_0x24 = 0;
  other = mv<kj::Own<kj::_::PromiseNode>>(innerParam);
  Own<kj::_::PromiseNode>::Own(&this->inner,other);
  this->onReadyEvent = (Event *)0x0;
  this->selfPtr = (Own<kj::_::PromiseNode> *)0x0;
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->inner);
  (*pPVar1->_vptr_PromiseNode[1])();
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->inner);
  (**pPVar1->_vptr_PromiseNode)(pPVar1,&this->super_Event);
  return;
}

Assistant:

ChainPromiseNode::ChainPromiseNode(Own<PromiseNode> innerParam)
    : state(STEP1), inner(kj::mv(innerParam)) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}